

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O1

void __thiscall
Engine_testAddIntegerWithTags_Test::~Engine_testAddIntegerWithTags_Test
          (Engine_testAddIntegerWithTags_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Engine, testAddIntegerWithTags) {
    Engine e("test", std::move(std::make_unique<TestHandler>()));
    e.Add("foo", 100000000, Tag("Hello", "World"), Tag("Another", "Tag"));
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100000000, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("Hello", im.tags[0].name);
    ASSERT_EQ("World", im.tags[0].value);
    ASSERT_EQ("Another", im.tags[1].name);
    ASSERT_EQ("Tag", im.tags[1].value);
}